

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O2

base_learner * mf_setup(options_i *options,vw *all)

{
  int iVar1;
  base_learner *l;
  single_learner *base;
  learner<mf,_example> *plVar2;
  free_ptr<mf> data;
  option_group_definition new_options;
  allocator local_20a;
  allocator local_209;
  free_ptr<mf> local_208;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  option_group_definition local_198;
  undefined1 local_160 [112];
  bool local_f0;
  typed_option<unsigned_long> local_c0;
  
  scoped_calloc_or_throw<mf>();
  std::__cxx11::string::string
            ((string *)&local_1b8,"Matrix Factorization Reduction",(allocator *)local_160);
  VW::config::option_group_definition::option_group_definition(&local_198,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_1d8,"new_mf",&local_209);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_160,&local_1d8,
             &(local_208._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.super__Head_base<0UL,_mf_*,_false>.
              _M_head_impl)->rank);
  local_f0 = true;
  std::__cxx11::string::string(local_1f8,"rank for reduction-based matrix factorization",&local_20a)
  ;
  std::__cxx11::string::_M_assign((string *)(local_160 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_c0,(typed_option<unsigned_long> *)local_160);
  VW::config::option_group_definition::add<unsigned_long>(&local_198,&local_c0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c0);
  std::__cxx11::string::~string(local_1f8);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_160);
  std::__cxx11::string::~string((string *)&local_1d8);
  (**options->_vptr_options_i)(options,&local_198);
  std::__cxx11::string::string((string *)local_160,"new_mf",(allocator *)local_1f8);
  iVar1 = (*options->_vptr_options_i[1])(options,local_160);
  std::__cxx11::string::~string((string *)local_160);
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<mf,_example> *)0x0;
  }
  else {
    (local_208._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.super__Head_base<0UL,_mf_*,_false>._M_head_impl)
    ->all = all;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(local_208._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.super__Head_base<0UL,_mf_*,_false>.
                 _M_head_impl)->pairs,&all->pairs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->pairs);
    all->random_positive_weights = true;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::init_learner<mf,example,LEARNER::learner<char,example>>
                       (&local_208,base,learn,predict<false>,
                        (local_208._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_mf_*,_false>._M_head_impl)->rank * 2 + 1);
    *(undefined8 *)(plVar2 + 0xb8) = *(undefined8 *)(plVar2 + 0x18);
    *(undefined8 *)(plVar2 + 0xc0) = *(undefined8 *)(plVar2 + 0x20);
    *(code **)(plVar2 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&local_198);
  std::unique_ptr<mf,_void_(*)(void_*)>::~unique_ptr(&local_208);
  return (base_learner *)plVar2;
}

Assistant:

base_learner* mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<mf>();
  option_group_definition new_options("Matrix Factorization Reduction");
  new_options.add(make_option("new_mf", data->rank).keep().help("rank for reduction-based matrix factorization"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("new_mf"))
    return nullptr;

  data->all = &all;
  // store global pairs in local data structure and clear global pairs
  // for eventual calls to base learner
  data->pairs = all.pairs;
  all.pairs.clear();

  all.random_positive_weights = true;

  learner<mf, example>& l =
      init_learner(data, as_singleline(setup_base(options, all)), learn, predict<false>, 2 * data->rank + 1);
  l.set_finish(finish);
  return make_base(l);
}